

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

container_t * convert_run_to_efficient_container(run_container_t *c,uint8_t *typecode_after)

{
  uint16_t *puVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  uint16_t *puVar5;
  int size;
  array_container_t *paVar6;
  uint8_t uVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  
  iVar4 = c->n_runs;
  size = run_container_cardinality(c);
  iVar11 = 0x1ffe;
  if (size * 2 < 0x1ffe) {
    iVar11 = size * 2;
  }
  uVar7 = '\x03';
  if (iVar11 < iVar4 * 4) {
    if (size < 0x1001) {
      paVar6 = array_container_create_given_capacity(size);
      paVar6->cardinality = 0;
      uVar12 = 0;
      uVar8 = (ulong)(uint)c->n_runs;
      if (c->n_runs < 1) {
        uVar8 = uVar12;
      }
      for (uVar14 = 0; uVar14 != uVar8; uVar14 = uVar14 + 1) {
        uVar2 = c->runs[uVar14].value;
        uVar3 = c->runs[uVar14].length;
        puVar5 = paVar6->array;
        uVar12 = (ulong)(int)uVar12;
        for (uVar15 = (uint)uVar2; uVar15 <= (uint)uVar3 + (uint)uVar2; uVar15 = uVar15 + 1) {
          puVar5[uVar12] = (uint16_t)uVar15;
          uVar12 = uVar12 + 1;
        }
        paVar6->cardinality = (int32_t)uVar12;
      }
      uVar7 = '\x02';
      c = (run_container_t *)paVar6;
    }
    else {
      paVar6 = (array_container_t *)bitset_container_create();
      uVar12 = 0;
      uVar8 = (ulong)(uint)c->n_runs;
      if (c->n_runs < 1) {
        uVar8 = uVar12;
      }
      for (; uVar12 != uVar8; uVar12 = uVar12 + 1) {
        uVar2 = c->runs[uVar12].value;
        uVar3 = c->runs[uVar12].length;
        if ((uint)uVar3 + (uint)uVar2 + 1 != (uint)uVar2) {
          uVar15 = (uint)uVar3 + (uint)uVar2;
          puVar5 = paVar6->array;
          uVar16 = (uint)(uVar2 >> 6);
          uVar14 = (ulong)uVar16;
          uVar13 = uVar15 >> 6;
          uVar17 = -1L << ((byte)uVar2 & 0x3f);
          bVar10 = (byte)uVar15;
          if (uVar16 == uVar13) {
            uVar17 = uVar17 << (~bVar10 & 0x3f);
          }
          else {
            uVar9 = (ulong)uVar16;
            *(ulong *)(puVar5 + uVar9 * 4) = *(ulong *)(puVar5 + uVar9 * 4) | uVar17;
            uVar14 = (ulong)uVar13;
            while (uVar9 = uVar9 + 1, uVar17 = 0xffffffffffffffff, uVar9 < uVar14) {
              puVar1 = puVar5 + uVar9 * 4;
              puVar1[0] = 0xffff;
              puVar1[1] = 0xffff;
              puVar1[2] = 0xffff;
              puVar1[3] = 0xffff;
            }
          }
          *(ulong *)(puVar5 + uVar14 * 4) =
               *(ulong *)(puVar5 + uVar14 * 4) | uVar17 >> (~bVar10 & 0x3f);
        }
      }
      paVar6->cardinality = size;
      uVar7 = '\x01';
      c = (run_container_t *)paVar6;
    }
  }
  *typecode_after = uVar7;
  return c;
}

Assistant:

container_t *convert_run_to_efficient_container(run_container_t *c,
                                                uint8_t *typecode_after) {
    int32_t size_as_run_container =
        run_container_serialized_size_in_bytes(c->n_runs);

    int32_t size_as_bitset_container =
        bitset_container_serialized_size_in_bytes();
    int32_t card = run_container_cardinality(c);
    int32_t size_as_array_container =
        array_container_serialized_size_in_bytes(card);

    int32_t min_size_non_run =
        size_as_bitset_container < size_as_array_container
            ? size_as_bitset_container
            : size_as_array_container;
    if (size_as_run_container <= min_size_non_run) {  // no conversion
        *typecode_after = RUN_CONTAINER_TYPE;
        return c;
    }
    if (card <= DEFAULT_MAX_SIZE) {
        // to array
        array_container_t *answer = array_container_create_given_capacity(card);
        answer->cardinality = 0;
        for (int rlepos = 0; rlepos < c->n_runs; ++rlepos) {
            int run_start = c->runs[rlepos].value;
            int run_end = run_start + c->runs[rlepos].length;

            for (int run_value = run_start; run_value <= run_end; ++run_value) {
                answer->array[answer->cardinality++] = (uint16_t)run_value;
            }
        }
        *typecode_after = ARRAY_CONTAINER_TYPE;
        return answer;
    }

    // else to bitset
    bitset_container_t *answer = bitset_container_create();

    for (int rlepos = 0; rlepos < c->n_runs; ++rlepos) {
        int start = c->runs[rlepos].value;
        int end = start + c->runs[rlepos].length;
        bitset_set_range(answer->words, start, end + 1);
    }
    answer->cardinality = card;
    *typecode_after = BITSET_CONTAINER_TYPE;
    return answer;
}